

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excl.c
# Opt level: O2

void nn_excl_term(nn_excl *self)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if (self->pipe == (nn_pipe *)0x0) {
    if (self->inpipe == (nn_pipe *)0x0) {
      if (self->outpipe == (nn_pipe *)0x0) {
        return;
      }
      nn_backtrace_print();
      pcVar1 = "!self->outpipe";
      uStack_10 = 0x28;
    }
    else {
      nn_backtrace_print();
      pcVar1 = "!self->inpipe";
      uStack_10 = 0x27;
    }
  }
  else {
    nn_backtrace_print();
    pcVar1 = "!self->pipe";
    uStack_10 = 0x26;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar1,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/utils/excl.c"
          ,uStack_10);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_excl_term (struct nn_excl *self)
{
    nn_assert (!self->pipe);
    nn_assert (!self->inpipe);
    nn_assert (!self->outpipe);
}